

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGLApplication.cpp
# Opt level: O0

void __thiscall fw::OpenGLApplication::destroy(OpenGLApplication *this)

{
  Writer *this_00;
  Writer local_80;
  OpenGLApplication *local_10;
  OpenGLApplication *this_local;
  
  local_10 = this;
  (*this->_vptr_OpenGLApplication[3])();
  glfwTerminate();
  el::base::Writer::Writer
            (&local_80,Info,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/framework/OpenGLApplication.cpp"
             ,0x67,"void fw::OpenGLApplication::destroy()",NormalLog,0);
  this_00 = el::base::Writer::construct(&local_80,1,"framework");
  el::base::Writer::operator<<(this_00,(char (*) [39])"Window destroyed and GLFW3 terminated.");
  el::base::Writer::~Writer(&local_80);
  return;
}

Assistant:

void OpenGLApplication::destroy()
{
    onDestroy();
    glfwTerminate();
    LOG(INFO) << "Window destroyed and GLFW3 terminated.";
}